

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

void __thiscall CVmHashTable::~CVmHashTable(CVmHashTable *this)

{
  if (((this->field_0x18 & 1) != 0) && (this->hash_function_ != (CVmHashFunc *)0x0)) {
    (*this->hash_function_->_vptr_CVmHashFunc[1])();
  }
  delete_all_entries(this);
  if (((this->field_0x18 & 2) != 0) && (this->table_ != (CVmHashEntry **)0x0)) {
    operator_delete__(this->table_);
    return;
  }
  return;
}

Assistant:

CVmHashTable::~CVmHashTable()
{
    /* delete the hash function object if I own it */
    if (own_hash_func_)
        delete hash_function_;

    /* delete each entry in the hash table */
    delete_all_entries();

    /* delete the hash table */
    if (own_hash_table_)
        delete [] table_;
}